

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Module.cpp
# Opt level: O0

void __thiscall remote::Module::CacheSymbolData(Module *this)

{
  long lVar1;
  ostream *poVar2;
  char *filename;
  void *__src;
  int local_a8 [2];
  Elf64_Ehdr ehdr;
  string local_58;
  void *local_38;
  void *elf_data;
  Module *local_10;
  Module *this_local;
  
  local_10 = this;
  GetPath_abi_cxx11_((string *)&elf_data,this);
  lVar1 = std::__cxx11::string::length();
  std::__cxx11::string::~string((string *)&elf_data);
  if (lVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"No path!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    GetPath_abi_cxx11_(&local_58,this);
    filename = (char *)std::__cxx11::string::c_str();
    __src = elf::Open(filename);
    std::__cxx11::string::~string((string *)&local_58);
    if (__src != (void *)0x0) {
      local_38 = __src;
      memcpy(local_a8,__src,0x40);
      if (local_a8[0] == 0x464c457f) {
        poVar2 = std::operator<<((ostream *)&std::cout,"ELF OK!");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        if ((ehdr.e_ident._10_2_ == 0x32) || (ehdr.e_ident._10_2_ == 0x3e)) {
          CacheSymbolData64(this,local_38);
        }
        else if (ehdr.e_ident._10_2_ == 1) {
          CacheSymbolData32(this,local_38);
        }
        else {
          poVar2 = std::operator<<((ostream *)&std::cout,"Arch problems??? Fgt.");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        }
        elf::Close(local_38);
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,"ELF header magic failed");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        free(local_38);
      }
    }
  }
  return;
}

Assistant:

void remote::Module::CacheSymbolData() {
    if(GetPath().length() == 0) {
        std::cout << "No path!" << std::endl;
        return;
    }

    void* elf_data = elf::Open(GetPath().c_str());

    if(elf_data == NULL)
        return;

    // We now have elf data!
    // We can check the 'basic' variables like magic and machine without proper 32/64 alignment
    // We re-cast later when we have determined the proper arch
    Elf64_Ehdr ehdr = *(Elf64_Ehdr*) elf_data;

    if(memcmp(ehdr.e_ident, ELFMAG, SELFMAG) != 0) {
        std::cout << "ELF header magic failed" << std::endl;
        free(elf_data);
        return;
    }
    std::cout << "ELF OK!" << std::endl;

    if(ehdr.e_machine == EM_IA_64 || ehdr.e_machine == EM_X86_64) {
        CacheSymbolData64(elf_data);
    } else if(ehdr.e_machine == EM_M32) {
        CacheSymbolData32(elf_data);
    } else {
        std::cout << "Arch problems??? Fgt." << std::endl;
    }

    elf::Close(elf_data);
}